

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O0

bool __thiscall DIS::BeamData::operator==(BeamData *this,BeamData *rhs)

{
  bool local_19;
  bool ivarsEqual;
  BeamData *rhs_local;
  BeamData *this_local;
  
  local_19 = true;
  if ((this->_beamAzimuthCenter != rhs->_beamAzimuthCenter) ||
     (NAN(this->_beamAzimuthCenter) || NAN(rhs->_beamAzimuthCenter))) {
    local_19 = false;
  }
  if ((this->_beamAzimuthSweep != rhs->_beamAzimuthSweep) ||
     (NAN(this->_beamAzimuthSweep) || NAN(rhs->_beamAzimuthSweep))) {
    local_19 = false;
  }
  if ((this->_beamElevationCenter != rhs->_beamElevationCenter) ||
     (NAN(this->_beamElevationCenter) || NAN(rhs->_beamElevationCenter))) {
    local_19 = false;
  }
  if ((this->_beamElevationSweep != rhs->_beamElevationSweep) ||
     (NAN(this->_beamElevationSweep) || NAN(rhs->_beamElevationSweep))) {
    local_19 = false;
  }
  if ((this->_beamSweepSync != rhs->_beamSweepSync) ||
     (NAN(this->_beamSweepSync) || NAN(rhs->_beamSweepSync))) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool BeamData::operator ==(const BeamData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_beamAzimuthCenter == rhs._beamAzimuthCenter) ) ivarsEqual = false;
     if( ! (_beamAzimuthSweep == rhs._beamAzimuthSweep) ) ivarsEqual = false;
     if( ! (_beamElevationCenter == rhs._beamElevationCenter) ) ivarsEqual = false;
     if( ! (_beamElevationSweep == rhs._beamElevationSweep) ) ivarsEqual = false;
     if( ! (_beamSweepSync == rhs._beamSweepSync) ) ivarsEqual = false;

    return ivarsEqual;
 }